

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QTextBrowserPrivate::HistoryEntry>::moveAppend
          (QGenericArrayOps<QTextBrowserPrivate::HistoryEntry> *this,HistoryEntry *b,HistoryEntry *e
          )

{
  qsizetype *pqVar1;
  HistoryEntry *pHVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  undefined8 uVar7;
  HistoryEntry *pHVar8;
  int iVar9;
  
  if ((b != e) && (b < e)) {
    pHVar2 = (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size;
      pHVar2[lVar3].url.d = (b->url).d;
      pDVar4 = (b->title).d.d;
      (b->url).d = (QUrlPrivate *)0x0;
      (b->title).d.d = (Data *)0x0;
      pHVar2[lVar3].title.d.d = pDVar4;
      pcVar5 = (b->title).d.ptr;
      (b->title).d.ptr = (char16_t *)0x0;
      pHVar2[lVar3].title.d.ptr = pcVar5;
      qVar6 = (b->title).d.size;
      (b->title).d.size = 0;
      pHVar2[lVar3].title.d.size = qVar6;
      iVar9 = b->vpos;
      uVar7 = *(undefined8 *)&b->focusIndicatorPosition;
      pHVar8 = pHVar2 + lVar3;
      pHVar8->hpos = b->hpos;
      pHVar8->vpos = iVar9;
      *(undefined8 *)(&pHVar8->hpos + 2) = uVar7;
      pHVar2[lVar3].type = b->type;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QTextBrowserPrivate::HistoryEntry>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }